

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorLinearDriveline::VariablesFbReset(ChLinkMotorLinearDriveline *this)

{
  (**(code **)(**(long **)&(this->super_ChLinkMotorLinear).field_0x278 + 0x150))();
  (*(((this->innershaft2lin).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x2a])();
  (*(((this->innershaft2rot).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x2a])();
  return;
}

Assistant:

void ChLinkMotorLinearDriveline::VariablesFbReset() {
    // First, inherit to parent class
    ChLinkMotorLinear::VariablesFbReset();

    innershaft1lin->VariablesFbReset();
    innershaft2lin->VariablesFbReset();
    innershaft2rot->VariablesFbReset();
}